

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_f.c
# Opt level: O3

int load_column(ParseData *lParse,int varNum,long fRow,long nRows,void *data,char *undef)

{
  long lVar1;
  int iVar2;
  uchar *array;
  long lVar3;
  iteratorCol *piVar4;
  size_t __size;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  int status;
  ParseData *local_90;
  char msg [80];
  
  status = 0;
  piVar4 = lParse->colData + varNum;
  if (lParse->hdutype == 0) {
    ffgpf(piVar4->fptr,piVar4->datatype,fRow,nRows,data,undef,(int *)msg,&status);
    if (DEBUG_PIXFILTER != 0) {
      printf("load_column: IMAGE_HDU fRow=%ld, nRows=%ld => %d\n",fRow,nRows,(ulong)(uint)status);
    }
    goto LAB_00146053;
  }
  lVar1 = piVar4->repeat;
  lVar8 = lVar1 * nRows;
  iVar2 = piVar4->datatype;
  if (iVar2 < 0x10) {
    if (iVar2 == 0xb) {
      lVar8 = lVar1 + 0xe;
      if (-1 < lVar1 + 7) {
        lVar8 = lVar1 + 7;
      }
      __size = (lVar8 >> 3) * nRows;
      local_90 = lParse;
      array = (uchar *)malloc(__size);
      ffgcvb(piVar4->fptr,piVar4->colnum,fRow,1,__size,'\0',array,(int *)msg,&status);
      if (0 < nRows) {
        lVar1 = piVar4->repeat;
        lVar8 = lVar1 + 0xe;
        if (-1 < lVar1 + 7) {
          lVar8 = lVar1 + 7;
        }
        lVar3 = 0;
        do {
          if (lVar1 < 1) {
            lVar6 = 0;
          }
          else {
            lVar5 = lVar3 * (lVar8 >> 3) + 1;
            lVar7 = 0;
            do {
              uVar9 = (uint)lVar7 & 7;
              *(byte *)(*(long *)((long)data + lVar3 * 8) + lVar7) =
                   (array[lVar5] >> ((byte)uVar9 ^ 7) & 1) == 0 ^ 0x31;
              lVar5 = lVar5 + (ulong)(uVar9 == 7);
              lVar7 = lVar7 + 1;
              lVar6 = lVar1;
            } while (lVar1 != lVar7);
          }
          *(undefined1 *)(*(long *)((long)data + lVar3 * 8) + lVar6) = 0;
          lVar3 = lVar3 + 1;
        } while (lVar3 != nRows);
      }
      if (array == (uchar *)0x0) {
        printf("invalid free((char *)bytes) at %s:%d\n",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Starlink[P]cfitsio/eval_f.c",
               0xa6e);
        lParse = local_90;
      }
      else {
        free(array);
        lParse = local_90;
      }
      goto LAB_00146053;
    }
    if (iVar2 == 0xe) {
      ffgcfl(piVar4->fptr,piVar4->colnum,fRow,1,lVar8,(char *)data,undef,(int *)msg,&status);
      goto LAB_00146053;
    }
  }
  else {
    if (iVar2 == 0x10) {
      ffgcfs(piVar4->fptr,piVar4->colnum,fRow,1,nRows,(char **)data,undef,(int *)msg,&status);
      goto LAB_00146053;
    }
    if (iVar2 == 0x29) {
      ffgcfj(piVar4->fptr,piVar4->colnum,fRow,1,lVar8,(long *)data,undef,(int *)msg,&status);
      goto LAB_00146053;
    }
    if (iVar2 == 0x52) {
      ffgcfd(piVar4->fptr,piVar4->colnum,fRow,1,lVar8,(double *)data,undef,(int *)msg,&status);
      goto LAB_00146053;
    }
  }
  snprintf(msg,0x50,"load_column: unexpected datatype %d");
  ffpmsg(msg);
LAB_00146053:
  if (status == 0) {
    iVar2 = 0;
  }
  else {
    lParse->status = status;
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

static int load_column( ParseData *lParse, int varNum, long fRow, long nRows,
                        void *data, char *undef )
{
   iteratorCol *var;
   long nelem,nbytes,row,len,idx;
   char **bitStrs, msg[80];
   unsigned char *bytes;
   int status = 0, anynul;

   var = lParse->colData+varNum;
   if (lParse->hdutype == IMAGE_HDU) {
    /* This test would need to be on a per varNum basis to support
     * cross HDU operations */
    fits_read_imgnull(var->fptr, var->datatype, fRow, nRows,
                data, undef, &anynul, &status);
    if (DEBUG_PIXFILTER)
        printf("load_column: IMAGE_HDU fRow=%ld, nRows=%ld => %d\n",
                        fRow, nRows, status);
  } else { 

   nelem = nRows * var->repeat;

   switch( var->datatype ) {
   case TBYTE:
      nbytes = ((var->repeat+7)/8) * nRows;
      bytes = (unsigned char *)malloc( nbytes * sizeof(char) );

      ffgcvb(var->fptr, var->colnum, fRow, 1L, nbytes,
             0, bytes, &anynul, &status);

      nelem = var->repeat;
      bitStrs = (char **)data;
      for( row=0; row<nRows; row++ ) {
         idx = (row)*( (nelem+7)/8 ) + 1;
         for(len=0; len<nelem; len++) {
            if( bytes[idx] & (1<<(7-len%8)) )
               bitStrs[row][len] = '1';
            else
               bitStrs[row][len] = '0';
            if( len%8==7 ) idx++;
         }
         bitStrs[row][len] = '\0';
      }

      FREE( (char *)bytes );
      break;
   case TSTRING:
      ffgcfs(var->fptr, var->colnum, fRow, 1L, nRows,
             (char **)data, undef, &anynul, &status);
      break;
   case TLOGICAL:
      ffgcfl(var->fptr, var->colnum, fRow, 1L, nelem,
             (char *)data, undef, &anynul, &status);
      break;
   case TLONG:
      ffgcfj(var->fptr, var->colnum, fRow, 1L, nelem,
             (long *)data, undef, &anynul, &status);
      break;
   case TDOUBLE:
      ffgcfd(var->fptr, var->colnum, fRow, 1L, nelem,
             (double *)data, undef, &anynul, &status);
      break;
   default:
      snprintf(msg,80,"load_column: unexpected datatype %d", var->datatype);
      ffpmsg(msg);
   }
  }
   if( status ) {
      lParse->status = status;
      return pERROR;
   }

   return 0;
}